

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon.c
# Opt level: O0

void mondead_helper(monst *mtmp,int adtyp)

{
  permonst *mptr_00;
  boolean bVar1;
  int iVar2;
  obj *obj;
  obj *otmp;
  int tmp;
  permonst *mptr;
  int adtyp_local;
  monst *mtmp_local;
  
  if ((((*(uint *)&mtmp->field_0x60 >> 0x1b & 1) == 0) || (bVar1 = grddead(mtmp), bVar1 != '\0')) &&
     (lifesaved_monster(mtmp,adtyp), mtmp->mhp < 1)) {
    if (mtmp == u.usteed) {
      dismount_steed(0);
    }
    obj = which_armor(mtmp,1);
    if (((obj != (obj *)0x0) &&
        (((0x5e < obj->otyp && (obj->otyp < 0x6a)) || ((0x53 < obj->otyp && (obj->otyp < 0x5f))))))
       && ((obj_descr[objects[obj->otyp].oc_descr_idx].oc_descr != (char *)0x0 &&
           (iVar2 = strncmp(obj_descr[objects[obj->otyp].oc_descr_idx].oc_descr,"gold ",5),
           iVar2 == 0)))) {
      end_burn(obj,'\0');
    }
    bVar1 = does_block(level,(int)mtmp->mx,(int)mtmp->my,mtmp);
    if (bVar1 == '\0') {
      unblock_point((int)mtmp->mx,(int)mtmp->my);
    }
    mptr_00 = mtmp->data;
    if ((*(uint *)&mtmp->field_0x60 >> 4 & 7) == 0) {
      if (mtmp->data == mons + 0x11) {
        set_mon_data(mtmp,mons + 0x10f,-1);
      }
      else if (mtmp->data == mons + 0x17) {
        set_mon_data(mtmp,mons + 0x110,-1);
      }
      else if (mtmp->data == mons + 0x5d) {
        set_mon_data(mtmp,mons + 0x10e,-1);
      }
    }
    else {
      set_mon_data(mtmp,mons + cham_to_pm[*(uint *)&mtmp->field_0x60 >> 4 & 7],-1);
    }
    iVar2 = monsndx(mtmp->data);
    if (mvitals[iVar2].died != 0xff) {
      mvitals[iVar2].died = mvitals[iVar2].died + '\x01';
    }
    if ((((mtmp->data == mons + 0xea) || (mtmp->data == mons + 0x128)) ||
        (mtmp->data->msound == ' ')) || (mtmp->data == mons + 0x143)) {
      violated(9);
    }
    if (mtmp->m_id == quest_status.leader_m_id) {
      quest_status._0_4_ = quest_status._0_4_ & 0xffefffff | 0x100000;
    }
    if (mtmp->data->mlet == '%') {
      iVar2 = rnd(5);
      if (iVar2 == 1) {
        makemon(mtmp->data,level,(int)(level->dnstair).sx,(int)(level->dnstair).sy,0);
      }
      else if (iVar2 == 2) {
        makemon(mtmp->data,level,0,0,0);
      }
    }
    if ((*(uint *)&mtmp->field_0x60 >> 0x1d & 1) != 0) {
      wizdead();
    }
    if (mtmp->data->msound == ' ') {
      nemdead();
    }
    if ((*(uint *)&level->locations[mtmp->mx][mtmp->my].field_0x6 >> 3 & 1) != 0) {
      unmap_object((int)mtmp->mx,(int)mtmp->my);
    }
    m_detach(mtmp,mptr_00);
  }
  return;
}

Assistant:

void mondead_helper(struct monst *mtmp, int adtyp)
{
	const struct permonst *mptr;
	int tmp;
	struct obj *otmp;

	if (mtmp->isgd) {
		/* if we're going to abort the death, it *must* be before
		 * the m_detach or there will be relmon problems later */
		if (!grddead(mtmp)) return;
	}
	lifesaved_monster(mtmp, adtyp);
	if (mtmp->mhp > 0) return;

	/* Player is thrown from his steed when it dies */
	if (mtmp == u.usteed)
		dismount_steed(DISMOUNT_GENERIC);

	/* extinguish monster's armor */
	if ((otmp = which_armor(mtmp, W_ARM)) && Is_gold_dragon_armor(otmp->otyp))
	    end_burn(otmp, FALSE);

	/* monster should no longer block vision */
	if (!does_block(level, mtmp->mx, mtmp->my, mtmp))
	    unblock_point(mtmp->mx, mtmp->my);

	mptr = mtmp->data;		/* save this for m_detach() */
	/* restore chameleon, lycanthropes to true form at death */
	if (mtmp->cham)
	    set_mon_data(mtmp, &mons[cham_to_pm[mtmp->cham]], -1);
	else if (mtmp->data == &mons[PM_WEREJACKAL])
	    set_mon_data(mtmp, &mons[PM_HUMAN_WEREJACKAL], -1);
	else if (mtmp->data == &mons[PM_WEREWOLF])
	    set_mon_data(mtmp, &mons[PM_HUMAN_WEREWOLF], -1);
	else if (mtmp->data == &mons[PM_WERERAT])
	    set_mon_data(mtmp, &mons[PM_HUMAN_WERERAT], -1);

	/* if MAXMONNO monsters of a given type have died, and it
	 * can be done, extinguish that monster.
	 *
	 * mvitals[].died does double duty as total number of dead monsters
	 * and as experience factor for the player killing more monsters.
	 * this means that a dragon dying by other means reduces the
	 * experience the player gets for killing a dragon directly; this
	 * is probably not too bad, since the player likely finagled the
	 * first dead dragon via ring of conflict or pets, and extinguishing
	 * based on only player kills probably opens more avenues of abuse
	 * for rings of conflict and such.
	 */
	tmp = monsndx(mtmp->data);
	if (mvitals[tmp].died < 255) mvitals[tmp].died++;

	/* killing an artifact-guardian is ordinary robbery */
	if (is_guardian(mtmp->data))
	    violated(CONDUCT_THIEVERY);

	/* if it's a (possibly polymorphed) quest leader, mark him as dead */
	if (mtmp->m_id == quest_status.leader_m_id)
	    quest_status.leader_is_dead = TRUE;

	if (mtmp->data->mlet == S_KOP) {
	    /* Dead Kops may come back. */
	    switch(rnd(5)) {
		case 1:	     /* returns near the stairs */
			makemon(mtmp->data, level, level->dnstair.sx, level->dnstair.sy, NO_MM_FLAGS);
			break;
		case 2:	     /* randomly */
			makemon(mtmp->data, level, 0, 0, NO_MM_FLAGS);
			break;
		default:
			break;
	    }
	}

	if (mtmp->iswiz) wizdead();
	if (mtmp->data->msound == MS_NEMESIS) nemdead();
	if (level->locations[mtmp->mx][mtmp->my].mem_invis)
	    unmap_object(mtmp->mx, mtmp->my);
	m_detach(mtmp, mptr);
}